

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

Vec_Int_t * Emb_ManConnectedComponents(Emb_Man_t *p)

{
  int *piVar1;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  int v;
  
  p_00 = Vec_IntAlloc(1000);
  p_01 = Vec_IntAlloc(1000);
  p_02 = Vec_IntAlloc(1000);
  p->nReached = 0;
  p->nTravIds = p->nTravIds + 1;
  for (v = 0; v < p->pGia->vCos->nSize; v = v + 1) {
    pGVar2 = Gia_ManCo(p->pGia,v);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    uVar3 = (ulong)pGVar2->Value;
    piVar1 = p->pObjData;
    if (piVar1[uVar3 + 3] != p->nTravIds) {
      piVar1[uVar3 + 3] = p->nTravIds;
      Vec_IntPush(p_00,piVar1[uVar3 + 2]);
      p_01->nSize = 0;
      Vec_IntPush(p_01,piVar1[uVar3 + 2]);
      Emb_ManPerformBfs(p,p_01,p_02,(Emb_Dat_t *)0x0);
    }
  }
  Vec_IntFree(p_01);
  Vec_IntFree(p_02);
  return p_00;
}

Assistant:

Vec_Int_t * Emb_ManConnectedComponents( Emb_Man_t * p )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vThis, * vNext, * vResult;
    Emb_Obj_t * pThis;
    int i;
    vResult = Vec_IntAlloc( 1000 );
    vThis   = Vec_IntAlloc( 1000 );
    vNext   = Vec_IntAlloc( 1000 );
    p->nReached = 0;
    Emb_ManIncrementTravId( p );
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        pThis = Emb_ManObj( p, Gia_ObjValue(pObj) );
        if ( Emb_ObjIsTravIdCurrent(p, pThis) )
            continue;
        Emb_ObjSetTravIdCurrent( p, pThis );
        Vec_IntPush( vResult, pThis->hHandle );
        // perform BFS from this node
        Vec_IntClear( vThis );
        Vec_IntPush( vThis, pThis->hHandle );
        Emb_ManPerformBfs( p, vThis, vNext, NULL ); 
    }
    Vec_IntFree( vThis );
    Vec_IntFree( vNext );
    return vResult;
}